

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall
TPZVec<TPZGeoElSidePartition>::TPZVec
          (TPZVec<TPZGeoElSidePartition> *this,TPZVec<TPZGeoElSidePartition> *copy)

{
  undefined8 *puVar1;
  ulong uVar2;
  TPZGeoElSidePartition *pTVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  TPZGeoElSidePartition *pTVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_01920ce0;
  this->fStore = (TPZGeoElSidePartition *)0x0;
  uVar2 = copy->fNElements;
  if ((long)uVar2 < 1) {
    pTVar8 = (TPZGeoElSidePartition *)0x0;
  }
  else {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar2;
    uVar5 = SUB168(auVar4 * ZEXT816(0x38),0);
    uVar6 = uVar5 + 8;
    if (0xfffffffffffffff7 < uVar5) {
      uVar6 = 0xffffffffffffffff;
    }
    uVar5 = 0xffffffffffffffff;
    if (SUB168(auVar4 * ZEXT816(0x38),8) == 0) {
      uVar5 = uVar6;
    }
    puVar7 = (ulong *)operator_new__(uVar5);
    *puVar7 = uVar2;
    pTVar8 = (TPZGeoElSidePartition *)(puVar7 + 1);
    lVar9 = 0;
    do {
      *(undefined ***)((long)puVar7 + lVar9 + 8) = &PTR__TPZGeoElSide_01920090;
      *(undefined8 *)((long)puVar7 + lVar9 + 0x10) = 0;
      *(undefined4 *)((long)puVar7 + lVar9 + 0x18) = 0xffffffff;
      *(undefined ***)((long)puVar7 + lVar9 + 0x20) = &PTR__TPZVec_01920ce0;
      puVar1 = (undefined8 *)((long)puVar7 + lVar9 + 0x28);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)puVar7 + lVar9 + 0x38) = 0;
      lVar9 = lVar9 + 0x38;
    } while (uVar2 * 0x38 - lVar9 != 0);
  }
  this->fStore = pTVar8;
  lVar9 = copy->fNElements;
  if (0 < lVar9) {
    lVar11 = 0x18;
    lVar10 = 0;
    do {
      pTVar8 = copy->fStore;
      pTVar3 = this->fStore;
      *(undefined4 *)((long)pTVar3 + lVar11 + -8) = *(undefined4 *)((long)pTVar8 + lVar11 + -8);
      *(undefined8 *)((long)pTVar3 + lVar11 + -0x10) =
           *(undefined8 *)((long)pTVar8 + lVar11 + -0x10);
      operator=((TPZVec<TPZGeoElSidePartition> *)
                ((long)&(pTVar3->fCurrent).super_TPZSavable._vptr_TPZSavable + lVar11),
                (TPZVec<TPZGeoElSidePartition> *)
                ((long)&(pTVar8->fCurrent).super_TPZSavable._vptr_TPZSavable + lVar11));
      lVar10 = lVar10 + 1;
      lVar9 = copy->fNElements;
      lVar11 = lVar11 + 0x38;
    } while (lVar10 < lVar9);
  }
  this->fNElements = lVar9;
  this->fNAlloc = copy->fNAlloc;
  return;
}

Assistant:

TPZVec<T>::TPZVec(const TPZVec<T> &copy){
	fStore = nullptr;
	
	if( copy.fNElements > 0 )
		fStore = new T[copy.fNElements];
	else
		fStore = nullptr;
	
	for(int64_t i=0; i<copy.fNElements; i++)
		fStore[i]=copy.fStore[i];
	
	fNElements = copy.fNElements;
    fNAlloc = copy.fNAlloc;
}